

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag.c
# Opt level: O0

void apriltag_detector_clear_families(apriltag_detector_t *td)

{
  int iVar1;
  int iVar2;
  apriltag_family_t *local_20;
  apriltag_family_t *fam;
  apriltag_detector_t *paStack_10;
  int i;
  apriltag_detector_t *td_local;
  
  fam._4_4_ = 0;
  paStack_10 = td;
  while( true ) {
    iVar1 = fam._4_4_;
    iVar2 = zarray_size(paStack_10->tag_families);
    if (iVar2 <= iVar1) break;
    zarray_get(paStack_10->tag_families,fam._4_4_,&local_20);
    quick_decode_uninit(local_20);
    fam._4_4_ = fam._4_4_ + 1;
  }
  zarray_clear(paStack_10->tag_families);
  return;
}

Assistant:

void apriltag_detector_clear_families(apriltag_detector_t *td)
{
    for (int i = 0; i < zarray_size(td->tag_families); i++) {
        apriltag_family_t *fam;
        zarray_get(td->tag_families, i, &fam);
        quick_decode_uninit(fam);
    }
    zarray_clear(td->tag_families);
}